

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducemin(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceMinLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducemin(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducemin(this);
    this_00 = (ReduceMinLayerParams *)operator_new(0x30);
    ReduceMinLayerParams::ReduceMinLayerParams(this_00);
    (this->layer_).reducemin_ = this_00;
  }
  return (ReduceMinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMinLayerParams* NeuralNetworkLayer::mutable_reducemin() {
  if (!has_reducemin()) {
    clear_layer();
    set_has_reducemin();
    layer_.reducemin_ = new ::CoreML::Specification::ReduceMinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceMin)
  return layer_.reducemin_;
}